

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIASound.cpp
# Opt level: O1

void __thiscall
Atari2600::TIASound::apply_samples<(Outputs::Speaker::Action)0>
          (TIASound *this,size_t number_of_samples,MonoSample *target)

{
  byte bVar1;
  short sVar2;
  int iVar3;
  uint uVar4;
  MonoSample output;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  
  if (number_of_samples != 0) {
    uVar8 = 0;
    do {
      sVar2 = this->per_channel_volume_;
      lVar9 = 0xc;
      iVar5 = 0;
      do {
        iVar3 = *(int *)(this->volume_ + lVar9 * 4 + -8) + 1;
        *(int *)(this->volume_ + lVar9 * 4 + -8) = iVar3;
        uVar7 = 0;
        if (0xf < this->volume_[lVar9 + -8]) goto LAB_00301f7f;
        iVar3 = iVar3 / 0x13;
        switch(this->volume_[lVar9 + -8]) {
        default:
          uVar7 = 1;
          break;
        case '\x01':
          uVar4 = *(uint *)(this->volume_ + lVar9 * 4 + -0x28);
          uVar7 = uVar4 & 1;
          if (iVar3 == this->volume_[lVar9 + -10] + 1) {
            *(undefined4 *)(this->volume_ + lVar9 * 4 + -8) = 0;
            *(uint *)(this->volume_ + lVar9 * 4 + -0x28) =
                 (uVar4 << 2 ^ uVar4 * 8) & 8 | (int)uVar4 >> 1;
          }
          break;
        case '\x02':
          uVar4 = *(uint *)(this->volume_ + lVar9 * 4 + -0x28);
          uVar7 = uVar4 & 1;
          bVar1 = this->volume_[lVar9 + -10];
          if (iVar3 % (int)(((uint)bVar1 * 0x20 - ((uint)bVar1 + (uint)bVar1)) + 0x1e) == 0x12) {
            *(uint *)(this->volume_ + lVar9 * 4 + -0x28) =
                 (uVar4 << 2 ^ uVar4 * 8) & 8 | (int)uVar4 >> 1;
          }
          break;
        case '\x03':
          uVar7 = *(uint *)(this->volume_ + lVar9 * 4 + -0x10);
          if (iVar3 == this->volume_[lVar9 + -10] + 1) {
            if ((this->volume_[lVar9 * 4 + -0x20] & 1) != 0) {
              uVar4 = *(uint *)(this->volume_ + lVar9 * 4 + -0x28);
              *(uint *)(this->volume_ + lVar9 * 4 + -0x10) = uVar4 & 1;
              *(uint *)(this->volume_ + lVar9 * 4 + -0x28) =
                   (uVar4 << 2 ^ uVar4 * 8) & 8 | (int)uVar4 >> 1;
            }
            iVar3 = *(int *)(this->volume_ + lVar9 * 4 + -0x20);
            *(uint *)(this->volume_ + lVar9 * 4 + -0x20) =
                 (iVar3 << 2 ^ iVar3 << 4) & 0x10U | iVar3 >> 1;
          }
          break;
        case '\x04':
        case '\x05':
          iVar6 = this->volume_[lVar9 + -10] + 1;
          goto LAB_00301d93;
        case '\x06':
        case '\n':
          iVar6 = this->volume_[lVar9 + -10] + 1;
          goto LAB_00301dca;
        case '\a':
        case '\t':
          uVar4 = *(uint *)(this->volume_ + lVar9 * 4 + -0x20);
          iVar6 = this->volume_[lVar9 + -10] + 1;
          goto LAB_00301f0f;
        case '\b':
          uVar4 = *(uint *)(this->volume_ + lVar9 * 4 + -0x18);
          uVar7 = uVar4 & 1;
          if (iVar3 == this->volume_[lVar9 + -10] + 1) {
            *(undefined4 *)(this->volume_ + lVar9 * 4 + -8) = 0;
            *(uint *)(this->volume_ + lVar9 * 4 + -0x18) =
                 (uVar4 << 8 ^ uVar4 << 4) & 0x100 | (int)uVar4 >> 1;
          }
          break;
        case '\f':
        case '\r':
          iVar6 = (uint)this->volume_[lVar9 + -10] + (uint)this->volume_[lVar9 + -10] * 2 + 3;
LAB_00301d93:
          uVar7 = iVar3 / iVar6 & 1;
          break;
        case '\x0e':
          iVar6 = (uint)this->volume_[lVar9 + -10] + (uint)this->volume_[lVar9 + -10] * 2 + 3;
LAB_00301dca:
          uVar7 = (uint)((iVar3 / iVar6) % 0x1e < 0x13);
          break;
        case '\x0f':
          uVar4 = *(uint *)(this->volume_ + lVar9 * 4 + -0x20);
          iVar6 = (uint)this->volume_[lVar9 + -10] + (uint)this->volume_[lVar9 + -10] * 2 + 3;
LAB_00301f0f:
          uVar7 = uVar4 & 1;
          if (iVar3 == iVar6) {
            *(undefined4 *)(this->volume_ + lVar9 * 4 + -8) = 0;
            *(uint *)(this->volume_ + lVar9 * 4 + -0x20) =
                 (uVar4 << 2 ^ uVar4 << 4) & 0x10 | (int)uVar4 >> 1;
          }
        }
LAB_00301f7f:
        iVar5 = iVar5 + (this->volume_[lVar9 + -0xc] * uVar7 * (int)sVar2 >> 4);
        lVar9 = lVar9 + 1;
      } while (lVar9 == 0xd);
      target[uVar8] = (MonoSample)iVar5;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (uVar8 < number_of_samples);
  }
  return;
}

Assistant:

void Atari2600::TIASound::apply_samples(std::size_t number_of_samples, Outputs::Speaker::MonoSample *target) {
	for(unsigned int c = 0; c < number_of_samples; c++) {
		Outputs::Speaker::MonoSample output = 0;
		for(int channel = 0; channel < 2; channel++) {
			divider_counter_[channel] ++;
			int divider_value = divider_counter_[channel] / (38 / CPUTicksPerAudioTick);
			int level = 0;
			switch(control_[channel]) {
				case 0x0: case 0xb:	// constant 1
					level = 1;
				break;

				case 0x4: case 0x5:	// div2 tone
					level = (divider_value / (divider_[channel]+1))&1;
				break;

				case 0xc: case 0xd:	// div6 tone
					level = (divider_value / ((divider_[channel]+1)*3))&1;
				break;

				case 0x6: case 0xa:	// div31 tone
					level = (divider_value / (divider_[channel]+1))%30 <= 18;
				break;

				case 0xe:			// div93 tone
					level = (divider_value / ((divider_[channel]+1)*3))%30 <= 18;
				break;

				case 0x1:			// 4-bit poly
					level = poly4_counter_[channel]&1;
					if(divider_value == divider_[channel]+1) {
						divider_counter_[channel] = 0;
						advance_poly4(channel);
					}
				break;

				case 0x2:			// 4-bit poly div31
					level = poly4_counter_[channel]&1;
					if(divider_value%(30*(divider_[channel]+1)) == 18) {
						advance_poly4(channel);
					}
				break;

				case 0x3:			// 5/4-bit poly
					level = output_state_[channel];
					if(divider_value == divider_[channel]+1) {
						if(poly5_counter_[channel]&1) {
							output_state_[channel] = poly4_counter_[channel]&1;
							advance_poly4(channel);
						}
						advance_poly5(channel);
					}
				break;

				case 0x7: case 0x9:	// 5-bit poly
					level = poly5_counter_[channel]&1;
					if(divider_value == divider_[channel]+1) {
						divider_counter_[channel] = 0;
						advance_poly5(channel);
					}
				break;

				case 0xf:			// 5-bit poly div6
					level = poly5_counter_[channel]&1;
					if(divider_value == (divider_[channel]+1)*3) {
						divider_counter_[channel] = 0;
						advance_poly5(channel);
					}
				break;

				case 0x8:			// 9-bit poly
					level = poly9_counter_[channel]&1;
					if(divider_value == divider_[channel]+1) {
						divider_counter_[channel] = 0;
						advance_poly9(channel);
					}
				break;
			}

			output += (volume_[channel] * per_channel_volume_ * level) >> 4;
		}
		Outputs::Speaker::apply<action>(target[c], output);
	}
}